

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_18::Updater::walk(Updater *this,Expression **curr)

{
  Builder *pBVar1;
  Name name_00;
  size_t this_00;
  bool bVar2;
  size_type sVar3;
  ArenaVector<wasm::Expression_*> *items;
  Block *item;
  Break *item_00;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_01;
  ExpressionList *this_02;
  string *in_R9;
  optional<wasm::Type> type_;
  Name NVar4;
  pair<std::_Rb_tree_const_iterator<wasm::Name>,_bool> pVar5;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  undefined1 local_190 [12];
  Type local_180;
  size_t local_178;
  char *pcStack_170;
  BasicType local_15c;
  undefined1 local_158 [12];
  size_t local_148;
  char *pcStack_140;
  Break *local_130;
  initializer_list<wasm::Expression_*> local_128;
  size_t local_118;
  char *pcStack_110;
  undefined1 local_108 [12];
  Block *local_f8;
  Block *oldBody;
  undefined1 local_e8;
  allocator<char> local_d9;
  string local_d8 [32];
  anon_class_8_1_e92f3c79 local_b8;
  function<bool_(wasm::Name)> local_b0;
  Name local_80;
  undefined1 auStack_70 [8];
  Name name;
  value_type *info;
  undefined1 local_50 [4];
  Index i;
  NameSet blockNames;
  Block *body;
  Expression **curr_local;
  Updater *this_local;
  
  Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  ::walk((Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
          *)this,curr);
  bVar2 = std::
          vector<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
          ::empty(&this->returnCallInfos);
  if (!bVar2) {
    blockNames._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)Builder::blockify(this->builder,*curr,(Expression *)0x0);
    *curr = (Expression *)blockNames._M_t._M_impl.super__Rb_tree_header._M_node_count;
    BranchUtils::BranchAccumulator::get
              ((NameSet *)local_50,
               (Expression *)blockNames._M_t._M_impl.super__Rb_tree_header._M_node_count);
    for (info._4_4_ = 0;
        sVar3 = std::
                vector<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
                ::size(&this->returnCallInfos), info._4_4_ < sVar3; info._4_4_ = info._4_4_ + 1) {
      name.super_IString.str._M_str =
           (char *)std::
                   vector<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
                   ::operator[](&this->returnCallInfos,(ulong)info._4_4_);
      wasm::Name::Name(&local_80,"__return_call");
      local_b8.blockNames = (NameSet *)local_50;
      std::function<bool(wasm::Name)>::
      function<wasm::(anonymous_namespace)::Updater::walk(wasm::Expression*&)::_lambda(wasm::Name)_1_,void>
                ((function<bool(wasm::Name)> *)&local_b0,&local_b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_d8,"_",&local_d9);
      NVar4.super_IString.str._M_str = (char *)&local_b0;
      NVar4.super_IString.str._M_len = (size_t)local_80.super_IString.str._M_str;
      NVar4 = Names::getValidName((Names *)local_80.super_IString.str._M_len,NVar4,
                                  (function<bool_(wasm::Name)> *)(ulong)info._4_4_,(Index)local_d8,
                                  in_R9);
      name.super_IString.str._M_len = NVar4.super_IString.str._M_str;
      auStack_70 = NVar4.super_IString.str._M_len;
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator(&local_d9);
      std::function<bool_(wasm::Name)>::~function(&local_b0);
      pVar5 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::insert
                        ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                         local_50,(value_type *)auStack_70);
      oldBody = (Block *)pVar5.first._M_node;
      local_e8 = pVar5.second;
      wasm::Name::operator=
                ((Name *)(*(long *)(name.super_IString.str._M_str + 8) + 0x10),(Name *)auStack_70);
      pBVar1 = this->builder;
      items = (ArenaVector<wasm::Expression_*> *)
              (blockNames._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20);
      std::optional<wasm::Type>::optional<wasm::Type_&,_true>
                ((optional<wasm::Type> *)local_108,
                 (Type *)(blockNames._M_t._M_impl.super__Rb_tree_header._M_node_count + 8));
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._12_4_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)local_108._0_8_;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_108[8];
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_3_ = local_108._9_3_;
      local_f8 = Builder::makeBlock<ArenaVector<wasm::Expression_*>,_true>(pBVar1,items,type);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::clear
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                 (blockNames._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20));
      bVar2 = wasm::Type::isConcrete(&this->resultType);
      if (bVar2) {
        this_01 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                  (blockNames._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20);
        pBVar1 = this->builder;
        local_118 = (size_t)auStack_70;
        pcStack_110 = (char *)name.super_IString.str._M_len;
        local_148 = (this->returnName).super_IString.str._M_len;
        pcStack_140 = (this->returnName).super_IString.str._M_str;
        local_130 = Builder::makeBreak(this->builder,(Name)(this->returnName).super_IString.str,
                                       (Expression *)local_f8,(Expression *)0x0);
        local_128._M_array = (iterator)&local_130;
        local_128._M_len = 1;
        local_15c = none;
        std::optional<wasm::Type>::optional<wasm::Type::BasicType,_true>
                  ((optional<wasm::Type> *)local_158,&local_15c);
        name_00.super_IString.str._M_str = pcStack_110;
        name_00.super_IString.str._M_len = local_118;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._12_4_ = 0;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)local_158._0_8_;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_158[8];
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_3_ = local_158._9_3_;
        in_R9 = (string *)(ulong)local_158._8_4_;
        item = Builder::makeBlock(pBVar1,name_00,&local_128,type_00);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (this_01,(Expression *)item);
      }
      else {
        this_02 = &local_f8->list;
        local_178 = (this->returnName).super_IString.str._M_len;
        pcStack_170 = (this->returnName).super_IString.str._M_str;
        item_00 = Builder::makeBreak(this->builder,(Name)(this->returnName).super_IString.str,
                                     (Expression *)0x0,(Expression *)0x0);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&this_02->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)item_00);
        wasm::Name::operator=(&local_f8->name,(Name *)auStack_70);
        wasm::Type::Type(&local_180,none);
        (local_f8->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
             local_180.id;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                   (blockNames._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20),
                   (Expression *)local_f8);
      }
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                 (blockNames._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20),
                 *(Expression **)name.super_IString.str._M_str);
      this_00 = blockNames._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::optional<wasm::Type>::optional<wasm::Type_&,_true>
                ((optional<wasm::Type> *)local_190,&this->resultType);
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._12_4_ = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)local_190._0_8_;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_190[8];
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_3_ = local_190._9_3_;
      Block::finalize((Block *)this_00,type_,Unknown);
    }
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
              ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)local_50);
  }
  return;
}

Assistant:

void walk(Expression*& curr) {
    PostWalker<Updater>::walk(curr);
    if (returnCallInfos.empty()) {
      return;
    }

    Block* body = builder->blockify(curr);
    curr = body;
    auto blockNames = BranchUtils::BranchAccumulator::get(body);

    for (Index i = 0; i < returnCallInfos.size(); ++i) {
      auto& info = returnCallInfos[i];

      // Add a block containing the previous body and a branch up to the caller.
      // Give the block a name that will allow this return_call's original
      // callsite to branch out of it then execute the call before returning to
      // the caller.
      auto name = Names::getValidName(
        "__return_call", [&](Name test) { return !blockNames.count(test); }, i);
      blockNames.insert(name);
      info.branch->name = name;
      Block* oldBody = builder->makeBlock(body->list, body->type);
      body->list.clear();

      if (resultType.isConcrete()) {
        body->list.push_back(builder->makeBlock(
          name, {builder->makeBreak(returnName, oldBody)}, Type::none));
      } else {
        oldBody->list.push_back(builder->makeBreak(returnName));
        oldBody->name = name;
        oldBody->type = Type::none;
        body->list.push_back(oldBody);
      }
      body->list.push_back(info.call);
      body->finalize(resultType);
    }
  }